

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O1

pair<llvm::StringMapIterator<llvm::cl::Option_*>,_bool> __thiscall
llvm::StringMap<llvm::cl::Option*,llvm::MallocAllocator>::try_emplace<llvm::cl::Option*>
          (StringMap<llvm::cl::Option*,llvm::MallocAllocator> *this,StringRef Key,Option **Args)

{
  int iVar1;
  uint uVar2;
  StringMapEntry<llvm::cl::Option_*> *pSVar3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
  SVar5;
  Option **in_R8;
  StringRef Key_00;
  pair<llvm::StringMapIterator<llvm::cl::Option_*>,_bool> pVar6;
  
  uVar2 = StringMapImpl::LookupBucketFor((StringMapImpl *)this,Key);
  SVar5.Ptr = (StringMapEntryBase **)(*(long *)this + (ulong)uVar2 * 8);
  if (*SVar5.Ptr == (StringMapEntryBase *)0xfffffffffffffff8) {
    *(int *)(this + 0x10) = *(int *)(this + 0x10) + -1;
  }
  else if (*SVar5.Ptr != (StringMapEntryBase *)0x0) {
    for (; (*SVar5.Ptr == (StringMapEntryBase *)0x0 ||
           (*SVar5.Ptr == (StringMapEntryBase *)0xfffffffffffffff8)); SVar5.Ptr = SVar5.Ptr + 1) {
    }
    uVar4 = 0;
    goto LAB_0018caa3;
  }
  Key_00.Length = (size_t)(this + 0x18);
  Key_00.Data = (char *)Key.Length;
  pSVar3 = StringMapEntry<llvm::cl::Option*>::Create<llvm::MallocAllocator,llvm::cl::Option*>
                     ((StringMapEntry<llvm::cl::Option*> *)Key.Data,Key_00,(MallocAllocator *)Args,
                      in_R8);
  *SVar5.Ptr = &pSVar3->super_StringMapEntryBase;
  iVar1 = *(int *)(this + 0xc);
  *(int *)(this + 0xc) = iVar1 + 1;
  if (*(uint *)(this + 8) < (uint)(iVar1 + 1 + *(int *)(this + 0x10))) {
    __assert_fail("NumItems + NumTombstones <= NumBuckets",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringMap.h"
                  ,0x196,
                  "std::pair<iterator, bool> llvm::StringMap<llvm::cl::Option *>::try_emplace(StringRef, ArgsTy &&...) [ValueTy = llvm::cl::Option *, AllocatorTy = llvm::MallocAllocator, ArgsTy = <llvm::cl::Option *>]"
                 );
  }
  uVar2 = StringMapImpl::RehashTable((StringMapImpl *)this,uVar2);
  for (SVar5.Ptr = (StringMapEntryBase **)((ulong)uVar2 * 8 + *(long *)this);
      (*SVar5.Ptr == (StringMapEntryBase *)0x0 ||
      (*SVar5.Ptr == (StringMapEntryBase *)0xfffffffffffffff8)); SVar5.Ptr = SVar5.Ptr + 1) {
  }
  uVar4 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_0018caa3:
  pVar6._8_8_ = uVar4;
  pVar6.first.
  super_StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
  .Ptr = (StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
          )(StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
            )SVar5.Ptr;
  return pVar6;
}

Assistant:

std::pair<iterator, bool> try_emplace(StringRef Key, ArgsTy &&... Args) {
    unsigned BucketNo = LookupBucketFor(Key);
    StringMapEntryBase *&Bucket = TheTable[BucketNo];
    if (Bucket && Bucket != getTombstoneVal())
      return std::make_pair(iterator(TheTable + BucketNo, false),
                            false); // Already exists in map.

    if (Bucket == getTombstoneVal())
      --NumTombstones;
    Bucket = MapEntryTy::Create(Key, Allocator, std::forward<ArgsTy>(Args)...);
    ++NumItems;
    assert(NumItems + NumTombstones <= NumBuckets);

    BucketNo = RehashTable(BucketNo);
    return std::make_pair(iterator(TheTable + BucketNo, false), true);
  }